

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall amrex::MLEBABecLap::averageDownCoeffs(MLEBABecLap *this)

{
  pointer pVVar1;
  pointer pVVar2;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_> *b;
  long lVar3;
  bool bVar4;
  MLEBABecLap *pMVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_60;
  MLEBABecLap *local_48;
  long local_40;
  long local_38;
  
  lVar9 = (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels;
  local_48 = this;
  if (1 < lVar9) {
    lVar6 = lVar9 * 0x18;
    do {
      pVVar1 = (this->m_a_coeffs).
               super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (this->m_b_coeffs).
               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      GetVecOfPtrs<amrex::MultiFab>
                (&local_60,
                 (this->m_eb_b_coeffs).
                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      averageDownCoeffsSameAmrLevel
                (this,(int)(lVar9 + -1),
                 (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 ((long)&pVVar1[-1].super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                 lVar6),(Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         *)((long)&pVVar2[-1].
                                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                   .
                                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           + lVar6),&local_60);
      if (local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                        .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this = local_48;
      averageDownCoeffsToCoarseAmrLevel(local_48,(int)lVar9 + -1);
      bVar4 = 2 < lVar9;
      lVar9 = lVar9 + -1;
      lVar6 = lVar6 + -0x18;
    } while (bVar4);
  }
  a = (this->m_a_coeffs).
      super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      .
      super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  b = (this->m_b_coeffs).
      super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      .
      super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  GetVecOfPtrs<amrex::MultiFab>
            (&local_60,
             (this->m_eb_b_coeffs).
             super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
             .
             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  averageDownCoeffsSameAmrLevel(this,0,a,b,&local_60);
  if (local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels) {
    lVar9 = 0;
    pMVar5 = local_48;
    do {
      local_40 = lVar9;
      if (0 < (pMVar5->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9]) {
        lVar6 = 0;
        local_38 = 0;
        do {
          lVar7 = local_38 * 200;
          lVar8 = 0;
          do {
            lVar3 = *(long *)&(pMVar5->m_b_coeffs).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar9].
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            ;
            local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._0_12_ =
                 Geometry::periodicity
                           ((Geometry *)
                            (*(long *)&(pMVar5->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp
                                       .m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       .
                                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                            + lVar7));
            FabArray<amrex::FArrayBox>::FillBoundary<double>
                      ((FabArray<amrex::FArrayBox> *)(lVar3 + lVar6 + lVar8),
                       (Periodicity *)&local_60,false);
            lVar8 = lVar8 + 0x180;
            pMVar5 = local_48;
          } while (lVar8 != 0x480);
          local_38 = local_38 + 1;
          lVar6 = lVar6 + 0x480;
        } while (local_38 <
                 (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_40]);
      }
      lVar9 = local_40 + 1;
    } while (lVar9 < (pMVar5->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels)
    ;
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffs ()
{
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        auto& fine_a_coeffs = m_a_coeffs[amrlev];
        auto& fine_b_coeffs = m_b_coeffs[amrlev];

        averageDownCoeffsSameAmrLevel(amrlev, fine_a_coeffs, fine_b_coeffs,
                                      amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));
        averageDownCoeffsToCoarseAmrLevel(amrlev);
    }

    averageDownCoeffsSameAmrLevel(0, m_a_coeffs[0], m_b_coeffs[0],
                                  amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                m_b_coeffs[amrlev][mglev][idim].FillBoundary(m_geom[amrlev][mglev].periodicity());
            }
        }
    }
}